

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Vector2<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Vector2<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Vector2<float>_double_ptr_FileLoc_ptr *convert)

{
  Vector2<float> VVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *pPVar4;
  size_t __n;
  ulong uVar5;
  vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *pvVar6;
  int iVar7;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [64];
  allocator_type local_55;
  int local_54;
  vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *local_50;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  int local_34;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar9 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar9 = paVar2;
  }
  bVar13 = sVar3 == 0;
  local_50 = __return_storage_ptr__;
  if (!bVar13) {
    lVar12 = 0;
    local_48 = typeName;
    local_34 = nPerItem;
    do {
      pPVar4 = *(ParsedParameter **)((long)paVar9 + lVar12);
      __n = (pPVar4->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((local_40 = &pPVar4->name, __n == 0 ||
           (iVar7 = bcmp((local_40->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare((char *)pPVar4), iVar7 == 0)))) {
        pvVar8 = (*getValues)(pPVar4);
        pvVar6 = local_50;
        local_54 = local_34;
        uVar5 = pvVar8->nStored;
        if (uVar5 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&pPVar4->loc,"No values provided for \"%s\".",local_40);
        }
        uVar10 = (ulong)local_34;
        local_48 = (char *)uVar5;
        if (uVar5 % uVar10 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&pPVar4->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     local_40,&local_54);
        }
        pPVar4->lookedUp = true;
        std::vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>::vector
                  (local_50,uVar5 / uVar10,&local_55);
        if (uVar10 <= local_48) {
          uVar11 = 0;
          do {
            auVar14._0_8_ = (*convert)(pvVar8->ptr + (long)local_54 * uVar11,&pPVar4->loc);
            auVar14._8_56_ = extraout_var;
            VVar1.super_Tuple2<pbrt::Vector2,_float> =
                 (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar14._0_16_);
            (pvVar6->
            super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar11].super_Tuple2<pbrt::Vector2,_float> =
                 VVar1.super_Tuple2<pbrt::Vector2,_float>;
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar5 / uVar10);
        }
        if (!bVar13) {
          return local_50;
        }
        break;
      }
      lVar12 = lVar12 + 8;
      bVar13 = sVar3 << 3 == lVar12;
    } while (!bVar13);
  }
  (local_50->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_50;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}